

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeTypeFunction(ExpressionContext *ctx,SynTypeFunction *syntax)

{
  Lexeme *begin;
  Lexeme *end;
  IntrusiveList<SynCallArgument> arguments_00;
  TypeBase *value_00;
  SynCallArgument *pSVar1;
  SynFunctionCall *this;
  IntrusiveList<SynBase> local_58;
  SynBase *local_48;
  SynBase *curr;
  IntrusiveList<SynCallArgument> arguments;
  SynBase *value;
  TypeBase *type;
  SynTypeFunction *syntax_local;
  ExpressionContext *ctx_local;
  
  value_00 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  if (value_00 == (TypeBase *)0x0) {
    pSVar1 = (SynCallArgument *)ExpressionContext::get<SynTypeReference>(ctx);
    SynTypeReference::SynTypeReference
              ((SynTypeReference *)pSVar1,(syntax->super_SynBase).begin,(syntax->super_SynBase).end,
               syntax->returnType);
    arguments.tail = pSVar1;
    IntrusiveList<SynCallArgument>::IntrusiveList((IntrusiveList<SynCallArgument> *)&curr);
    for (local_48 = (syntax->arguments).head; local_48 != (SynBase *)0x0; local_48 = local_48->next)
    {
      pSVar1 = ExpressionContext::get<SynCallArgument>(ctx);
      SynCallArgument::SynCallArgument
                (pSVar1,local_48->begin,local_48->end,(SynIdentifier *)0x0,local_48);
      IntrusiveList<SynCallArgument>::push_back((IntrusiveList<SynCallArgument> *)&curr,pSVar1);
    }
    this = ExpressionContext::get<SynFunctionCall>(ctx);
    pSVar1 = arguments.tail;
    begin = (syntax->super_SynBase).begin;
    end = (syntax->super_SynBase).end;
    IntrusiveList<SynBase>::IntrusiveList(&local_58);
    arguments_00.tail = arguments.head;
    arguments_00.head = (SynCallArgument *)curr;
    SynFunctionCall::SynFunctionCall(this,begin,end,&pSVar1->super_SynBase,local_58,arguments_00);
    ctx_local = (ExpressionContext *)AnalyzeFunctionCall(ctx,this);
  }
  else {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeLiteral>(ctx);
    ExprTypeLiteral::ExprTypeLiteral
              ((ExprTypeLiteral *)ctx_local,&syntax->super_SynBase,ctx->typeTypeID,value_00);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeTypeFunction(ExpressionContext &ctx, SynTypeFunction *syntax)
{
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);

	// Transform 'type ref(arguments)' into a 'type ref' constructor call
	SynBase* value = new (ctx.get<SynTypeReference>()) SynTypeReference(syntax->begin, syntax->end, syntax->returnType);

	IntrusiveList<SynCallArgument> arguments;

	for(SynBase *curr = syntax->arguments.head; curr; curr = curr->next)
		arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

	return AnalyzeFunctionCall(ctx, new (ctx.get<SynFunctionCall>()) SynFunctionCall(syntax->begin, syntax->end, value, IntrusiveList<SynBase>(), arguments));
}